

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O0

int reschedule_recurring_test(size_t num_threads)

{
  int __how;
  int __fd;
  size_t in_RDI;
  shared_ptr<simple_thread_pool::TaskHandle> tt;
  size_t count;
  ThreadPoolMgr mgr;
  ThreadPoolOptions opt;
  string *in_stack_fffffffffffffd48;
  string *this;
  ThreadPoolMgr *in_stack_fffffffffffffd50;
  ThreadPoolMgr *this_00;
  anon_class_8_1_a7c1402f *__f;
  ThreadPoolMgr *this_01;
  string local_290 [20];
  TaskType in_stack_fffffffffffffd84;
  uint64_t in_stack_fffffffffffffd88;
  ThreadPoolMgrBase in_stack_fffffffffffffd90;
  ThreadPoolMgr *in_stack_fffffffffffffd98;
  anon_class_8_1_a7c1402f local_248 [23];
  ThreadPoolOptions local_20;
  size_t local_8;
  
  local_8 = in_RDI;
  simple_thread_pool::ThreadPoolOptions::ThreadPoolOptions(&local_20);
  local_20.numInitialThreads = local_8;
  this_01 = (ThreadPoolMgr *)(local_248 + 9);
  simple_thread_pool::ThreadPoolMgr::ThreadPoolMgr(in_stack_fffffffffffffd50);
  simple_thread_pool::ThreadPoolMgr::init(this_01,(EVP_PKEY_CTX *)&local_20);
  TestSuite::_msgt("begin\n");
  local_248[6].count = (size_t *)0x0;
  __f = local_248;
  std::function<void(simple_thread_pool::TaskResult_const&)>::
  function<reschedule_recurring_test(unsigned_long)::__0,void>
            ((function<void_(const_simple_thread_pool::TaskResult_&)> *)this_01,__f);
  simple_thread_pool::ThreadPoolMgr::addTask
            (in_stack_fffffffffffffd98,
             (TaskHandler *)in_stack_fffffffffffffd90._vptr_ThreadPoolMgrBase,
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
  std::function<void_(const_simple_thread_pool::TaskResult_&)>::~function
            ((function<void_(const_simple_thread_pool::TaskResult_&)> *)0x105542);
  this_00 = (ThreadPoolMgr *)&stack0xfffffffffffffd90;
  std::__cxx11::string::string((string *)this_00);
  TestSuite::sleep_sec((size_t)this_00,in_stack_fffffffffffffd48);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd90);
  std::__shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x105579);
  simple_thread_pool::TaskHandle::reschedule((TaskHandle *)this_01,(int64_t)__f);
  TestSuite::_msgt("rescheduled 200 ms -> 100 ms\n");
  this = local_290;
  std::__cxx11::string::string(this);
  __fd = (int)this;
  TestSuite::sleep_sec((size_t)this_00,(string *)this);
  std::__cxx11::string::~string(local_290);
  simple_thread_pool::ThreadPoolMgr::shutdown((ThreadPoolMgr *)(local_248 + 9),__fd,__how);
  std::shared_ptr<simple_thread_pool::TaskHandle>::~shared_ptr
            ((shared_ptr<simple_thread_pool::TaskHandle> *)0x1055dc);
  simple_thread_pool::ThreadPoolMgr::~ThreadPoolMgr(this_00);
  return 0;
}

Assistant:

int reschedule_recurring_test(size_t num_threads) {
    ThreadPoolOptions opt;
    opt.numInitialThreads = num_threads;

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");

    // Register a recurring timer whose interval is 200 ms.
    size_t count = 0;
    std::shared_ptr<TaskHandle> tt =
        mgr.addTask( [&count](const TaskResult& ret) {
                         TestSuite::_msgt("[%02zx] hello world %zu\n",
                                          tid_simple(), count++);
                     },
                     200000,
                     TaskType::RECURRING );
    // Wait 1 second, timer should be fired 5 times.
    TestSuite::sleep_sec(1);

    // Re-schedule the timer, now interval is 100 ms.
    tt->reschedule(100000);
    TestSuite::_msgt("rescheduled 200 ms -> 100 ms\n");

    // Wait another 1 second, timer should be fired 10 times.
    TestSuite::sleep_sec(1);

    // Shutdown thread pool.
    mgr.shutdown();
    return 0;
}